

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  int iVar1;
  wchar_t *__dest;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 *puVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  char_type buffer [13];
  undefined8 uStack_60;
  undefined1 auStack_58 [64];
  
  __dest = *it;
  uVar4 = *(uint *)this;
  uVar5 = (ulong)uVar4;
  iVar1 = *(int *)(this + 4);
  lVar10 = (long)iVar1;
  puVar7 = auStack_58 + lVar10 * 4;
  if (uVar5 < 100) {
    if (uVar4 < 10) goto LAB_0017b578;
    uVar6 = uVar5 * 2;
    *(int *)(auStack_58 + lVar10 * 4 + -4) =
         (int)(char)internal::basic_data<void>::DIGITS[uVar5 * 2 + 1];
LAB_0017b58f:
    puVar7 = puVar7 + -4;
  }
  else {
    iVar8 = 0;
    do {
      uVar6 = uVar5;
      uVar2 = (uint)uVar6;
      uVar4 = (uint)(uVar6 / 100);
      iVar3 = (int)(uVar6 / 100);
      uVar5 = (ulong)((uVar2 + iVar3 * -100) * 2);
      *(int *)(puVar7 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar5 + 1];
      if (iVar8 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        *(undefined4 *)(puVar7 + -8) = *(undefined4 *)(this + 8);
        *(int *)(puVar7 + -0xc) = (int)(char)internal::basic_data<void>::DIGITS[uVar5];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar9 = -0x10;
          goto LAB_0017b528;
        }
        puVar7 = puVar7 + -0xc;
      }
      else {
        *(int *)(puVar7 + -8) = (int)(char)internal::basic_data<void>::DIGITS[uVar5];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar9 = -0xc;
LAB_0017b528:
          *(undefined4 *)(puVar7 + lVar9) = *(undefined4 *)(this + 8);
          puVar7 = puVar7 + lVar9;
        }
        else {
          puVar7 = puVar7 + -8;
        }
      }
      iVar8 = iVar8 + 2;
      uVar5 = uVar6 / 100;
    } while (9999 < uVar2);
    if (uVar2 < 1000) {
LAB_0017b578:
      uVar4 = uVar4 | 0x30;
      goto LAB_0017b5a0;
    }
    uVar6 = (ulong)(uint)(iVar3 + (int)(uVar6 / 100));
    *(int *)(puVar7 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar6 + 1];
    if (0x55555555 < iVar8 * -0x55555555 + 0xaaaaaaabU) goto LAB_0017b58f;
    *(undefined4 *)(puVar7 + -8) = *(undefined4 *)(this + 8);
    puVar7 = puVar7 + -8;
  }
  uVar4 = (uint)(char)internal::basic_data<void>::DIGITS[uVar6 & 0xffffffff];
LAB_0017b5a0:
  *(uint *)(puVar7 + -4) = uVar4;
  if (iVar1 != 0) {
    uStack_60 = 0x17b5bc;
    memcpy(__dest,auStack_58,lVar10 * 4);
  }
  *it = __dest + lVar10;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }